

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void exprstat(LexState *ls)

{
  undefined1 local_38 [8];
  LHS_assign v;
  FuncState *fs;
  LexState *ls_local;
  
  v.v._16_8_ = ls->fs;
  suffixedexp(ls,(expdesc *)&v);
  if (((ls->t).token == 0x3d) || ((ls->t).token == 0x2c)) {
    local_38 = (undefined1  [8])0x0;
    assignment(ls,(LHS_assign *)local_38,1);
  }
  else {
    if ((int)v.prev != 0xd) {
      luaX_syntaxerror(ls,"syntax error");
    }
    *(uint *)(*(long *)(*(long *)v.v._16_8_ + 0x38) + (long)(int)v.v.k * 4) =
         *(uint *)(*(long *)(*(long *)v.v._16_8_ + 0x38) + (long)(int)v.v.k * 4) & 0xff803fff |
         0x4000;
  }
  return;
}

Assistant:

static void exprstat (LexState *ls) {
  /* stat -> func | assignment */
  FuncState *fs = ls->fs;
  struct LHS_assign v;
  suffixedexp(ls, &v.v);
  if (ls->t.token == '=' || ls->t.token == ',') { /* stat -> assignment ? */
    v.prev = NULL;
    assignment(ls, &v, 1);
  }
  else {  /* stat -> func */
    check_condition(ls, v.v.k == VCALL, "syntax error");
    SETARG_C(getinstruction(fs, &v.v), 1);  /* call statement uses no results */
  }
}